

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdKelvinDepthClamp::emulate_mthd(MthdKelvinDepthClamp *this)

{
  _Bool _Var1;
  MthdKelvinDepthClamp *this_local;
  
  pgraph_kelvin_check_err19(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  pgraph_kelvin_check_err18(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster & 0xffffffdf
         | (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x37) >> 0x3f) << 5);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster & 0xbfffffff
         | ((this->super_SingleMthdTest).super_MthdTest.val & 1) << 0x1e;
    pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x13,0,
                  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster,true
                 );
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_z_config =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_z_config &
         0xffffffef |
         (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3b) >> 0x3f) << 4);
    pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x42,0,
                  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_z_config,
                  true);
    _Var1 = nv04_pgraph_is_rankine_class
                      (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
    if ((_Var1) &&
       ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.card_type < 0x40)) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_ps_control =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_ps_control &
           0x7fffffff |
           (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x33) >> 0x3f) << 0x1f
                 );
      pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x52,0,
                    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                    bundle_ps_control,true);
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		pgraph_kelvin_check_err18(&exp);
		if (!exp.nsource) {
			insrt(exp.bundle_raster, 5, 1, extr(val, 8, 1));
			insrt(exp.bundle_raster, 30, 1, extr(val, 0, 1));
			pgraph_bundle(&exp, BUNDLE_RASTER, 0, exp.bundle_raster, true);
			insrt(exp.bundle_z_config, 4, 1, extr(val, 4, 1));
			pgraph_bundle(&exp, BUNDLE_Z_CONFIG, 0, exp.bundle_z_config, true);
			if (nv04_pgraph_is_rankine_class(&exp) && chipset.card_type < 0x40) {
				insrt(exp.bundle_ps_control, 31, 1, extr(val, 12, 1));
				pgraph_bundle(&exp, BUNDLE_PS_CONTROL, 0, exp.bundle_ps_control, true);
			}
		}
	}